

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O0

void __thiscall
gl4cts::DirectStateAccess::Buffers::ClearTest::ClearNamedBuffer<true>
          (ClearTest *this,GLuint buffer,GLenum internalformat,GLsizei size,GLenum format,
          GLenum type,GLvoid *data)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  GLenum type_local;
  GLenum format_local;
  GLsizei size_local;
  GLenum internalformat_local;
  GLuint buffer_local;
  ClearTest *this_local;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  (*this->m_pClearNamedBufferSubData)(buffer,internalformat,0,size,format,type,data);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"glClearNamedBufferData failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x2d7);
  return;
}

Assistant:

void ClearTest::ClearNamedBuffer<true>(glw::GLuint buffer, glw::GLenum internalformat, glw::GLsizei size,
									   glw::GLenum format, glw::GLenum type, glw::GLvoid* data)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	m_pClearNamedBufferSubData(buffer, internalformat, 0, size, format, type, data);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glClearNamedBufferData failed.");
}